

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMatching.cpp
# Opt level: O2

int32_t get_gpr_store_offset_as_int(Instruction *instr)

{
  bool bVar1;
  int32_t iVar2;
  
  bVar1 = is_gpr_store(instr);
  if (!bVar1) {
    __assert_fail("is_gpr_store(instr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/InstructionMatching.cpp"
                  ,0x107,"int32_t get_gpr_store_offset_as_int(const Instruction &)");
  }
  if (instr->n_src == '\x03') {
    iVar2 = InstructionAtom::get_imm(instr->src + 1);
    return iVar2;
  }
  __assert_fail("instr.n_src == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/InstructionMatching.cpp"
                ,0x108,"int32_t get_gpr_store_offset_as_int(const Instruction &)");
}

Assistant:

int32_t get_gpr_store_offset_as_int(const Instruction& instr) {
  assert(is_gpr_store(instr));
  assert(instr.n_src == 3);
  return instr.src[1].get_imm();
}